

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

appender __thiscall
fmt::v10::detail::write<char,fmt::v10::appender>
          (detail *this,appender out,basic_string_view<char> s,format_specs<char> *specs)

{
  presentation_type pVar1;
  char *size;
  counting_iterator width;
  appender aVar2;
  format_specs<char> *specs_00;
  string_view s_00;
  basic_string_view<char> str;
  string_view s_01;
  anon_class_40_4_6b3cdfe0 local_58;
  
  specs_00 = (format_specs<char> *)s.size_;
  str.size_ = s.data_;
  s_00.size_ = (char *)(long)specs_00->precision;
  size = str.size_;
  if ((-1 < (long)s_00.size_) && (s_00.size_ < str.size_)) {
    s_00.data_ = str.size_;
    size = (char *)code_point_index((detail *)
                                    out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                                    container,s_00,(size_t)specs_00);
  }
  pVar1 = specs_00->type;
  if (specs_00->width == 0) {
    width.count_ = 0;
  }
  else if (pVar1 == debug) {
    str.data_ = (char *)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container;
    width = write_escaped_string<char,fmt::v10::detail::counting_iterator>
                      ((counting_iterator)0x0,str);
  }
  else {
    s_01.size_ = (size_t)size;
    s_01.data_ = (char *)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container;
    width.count_ = compute_width(s_01);
  }
  local_58.is_debug = pVar1 == debug;
  local_58.s.data_ =
       (char *)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container;
  local_58.s.size_ = (size_t)str.size_;
  local_58.data = (char *)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container;
  local_58.size = (size_t)size;
  aVar2 = write_padded<(fmt::v10::align::type)1,fmt::v10::appender,char,fmt::v10::detail::write<char,fmt::v10::appender>(fmt::v10::appender,fmt::v10::basic_string_view<char>,fmt::v10::format_specs<char>const&)::_lambda(fmt::v10::appender)_1_>
                    ((appender)this,specs_00,(size_t)size,width.count_,&local_58);
  return (appender)aVar2.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container;
}

Assistant:

FMT_CONSTEXPR auto write(OutputIt out, basic_string_view<Char> s,
                         const format_specs<Char>& specs) -> OutputIt {
  auto data = s.data();
  auto size = s.size();
  if (specs.precision >= 0 && to_unsigned(specs.precision) < size)
    size = code_point_index(s, to_unsigned(specs.precision));
  bool is_debug = specs.type == presentation_type::debug;
  size_t width = 0;
  if (specs.width != 0) {
    if (is_debug)
      width = write_escaped_string(counting_iterator{}, s).count();
    else
      width = compute_width(basic_string_view<Char>(data, size));
  }
  return write_padded(out, specs, size, width,
                      [=](reserve_iterator<OutputIt> it) {
                        if (is_debug) return write_escaped_string(it, s);
                        return copy_str<Char>(data, data + size, it);
                      });
}